

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Entry * kj::_::
        CopyConstructArray_<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry,_kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry_*,_true,_false>
        ::apply(Entry *pos,Entry *start,Entry *end)

{
  anon_union_8_2_eba6ea51_for_Type_5 aVar1;
  AnnotatedHandler *pAVar2;
  uint8_t uVar3;
  bool bVar4;
  anon_union_2_2_d12d5221_for_Type_3 aVar5;
  undefined2 uVar6;
  ExceptionGuard local_18;
  
  for (; start != end; start = start + 1) {
    uVar3 = (start->key).listDepth;
    bVar4 = (start->key).isImplicitParam;
    aVar5 = (start->key).field_3;
    uVar6 = *(undefined2 *)&(start->key).field_0x6;
    aVar1 = (start->key).field_4;
    (pos->key).baseType = (start->key).baseType;
    (pos->key).listDepth = uVar3;
    (pos->key).isImplicitParam = bVar4;
    (pos->key).field_3 = aVar5;
    *(undefined2 *)&(pos->key).field_0x6 = uVar6;
    (pos->key).field_4 = aVar1;
    pAVar2 = (start->value).ptr.ptr;
    (pos->value).ptr.disposer = (start->value).ptr.disposer;
    (pos->value).ptr.ptr = pAVar2;
    (start->value).ptr.ptr = (AnnotatedHandler *)0x0;
    pos = pos + 1;
  }
  local_18.start = pos;
  local_18.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_18);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }